

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_print_progress(void)

{
  int interval;
  int decimals;
  char bkspc [6];
  
  stack0xfffffffffffffff2 = 0x8080808;
  decimals._2_2_ = 8;
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      printf("seconds into navigation: % *.0f",fsnav->imu->t,5);
      fsnav_ins_print_progress::counter = 0;
    }
    else if (fsnav->mode < 0) {
      printf("%s% *.0f",fsnav->imu->t,(long)&interval + 2,5);
    }
    else {
      if (fsnav_ins_print_progress::counter % 0x400 == 0) {
        printf("%s% *.0f",fsnav->imu->t,(long)&interval + 2,5);
      }
      fsnav_ins_print_progress::counter = fsnav_ins_print_progress::counter + 1;
    }
  }
  return;
}

Assistant:

void fsnav_ins_print_progress(void)
{	
	const char bkspc[] = "\b\b\b\b\b"; // возврат курсора
	const int 
		decimals = sizeof(bkspc)-1,    // количество выводимых десятичных знаков целой части
		interval = 1024;               // интервал вывода, в шагах
	static long counter;               // счётчик

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация частного алгоритма
	if (fsnav->mode == 0) {
		printf("seconds into navigation: % *.0f", decimals, fsnav->imu->t);
		counter = 0; // сброс счётчика
	}

	// завершение работы
	else if (fsnav->mode < 0)
		printf("%s% *.0f", bkspc, decimals, fsnav->imu->t); // печать конечного времени

	// операции на каждом шаге
	else {
		// печать на экран
		if (counter%interval == 0)
			printf("%s% *.0f", bkspc, decimals, fsnav->imu->t);
		counter++;
	}
}